

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  int *piVar1;
  char cVar2;
  void *pvVar3;
  ulong uVar4;
  int64_t iVar5;
  void *pvVar6;
  uint uVar7;
  wchar_t wVar8;
  int iVar9;
  size_t min;
  
  if (best_bid < L'!') {
    pvVar3 = a->format->data;
    uVar4 = __archive_read_seek(a,0,2);
    wVar8 = L'\0';
    if (0 < (long)uVar4) {
      min = 0x4000;
      if (uVar4 < 0x4000) {
        min = uVar4;
      }
      iVar5 = __archive_read_seek(a,(long)-(int)min,2);
      wVar8 = L'\0';
      if (-1 < iVar5) {
        wVar8 = L'\0';
        pvVar6 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if (pvVar6 != (void *)0x0) {
          for (uVar7 = (int)min - 0x16; 0 < (int)uVar7; uVar7 = uVar7 + iVar9) {
            uVar4 = (ulong)uVar7;
            cVar2 = *(char *)((long)pvVar6 + uVar4);
            if (cVar2 == '\x05') {
              iVar9 = -2;
            }
            else if (cVar2 == '\x06') {
              iVar9 = -3;
            }
            else {
              iVar9 = -1;
              if ((((cVar2 != 'K') && (iVar9 = -4, cVar2 == 'P')) &&
                  (piVar1 = (int *)((long)pvVar6 + uVar4), *piVar1 == 0x6054b50)) &&
                 ((((short)piVar1[1] == 0 && (*(short *)((long)piVar1 + 6) == 0)) &&
                  ((*(short *)((long)piVar1 + 10) == (short)piVar1[2] &&
                   ((long)(ulong)(uint)(piVar1[3] + piVar1[4]) <= (long)(uVar4 + iVar5))))))) {
                *(ulong *)((long)pvVar3 + 0x18) = (ulong)(uint)piVar1[4];
                if (uVar7 < 0x14) {
                  return L' ';
                }
                if (piVar1[-5] != 0x7064b50) {
                  return L' ';
                }
                if (piVar1[-4] != 0) {
                  return L' ';
                }
                if (piVar1[-1] != 1) {
                  return L' ';
                }
                iVar5 = __archive_read_seek(a,*(int64_t *)(piVar1 + -3),0);
                if (iVar5 < 0) {
                  return L' ';
                }
                pvVar6 = __archive_read_ahead(a,0x38,(ssize_t *)0x0);
                if (pvVar6 == (void *)0x0) {
                  return L' ';
                }
                if (*(long *)((long)pvVar6 + 4) - 0x3ff5U < 0xffffffffffffc037) {
                  return L' ';
                }
                pvVar6 = __archive_read_ahead(a,*(long *)((long)pvVar6 + 4) + 0xc,(ssize_t *)0x0);
                if (pvVar6 == (void *)0x0) {
                  return L' ';
                }
                if (*(int *)((long)pvVar6 + 0x10) != 0) {
                  return L' ';
                }
                if (*(int *)((long)pvVar6 + 0x14) != 0) {
                  return L' ';
                }
                if (*(long *)((long)pvVar6 + 0x18) != *(long *)((long)pvVar6 + 0x20)) {
                  return L' ';
                }
                *(undefined8 *)((long)pvVar3 + 0x18) = *(undefined8 *)((long)pvVar6 + 0x30);
                return L' ';
              }
            }
          }
        }
      }
    }
  }
  else {
    wVar8 = L'\xffffffff';
  }
  return wVar8;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) */
	tail = (int)zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* Boyer-Moore search backwards from the end, since we want
	 * to match the last EOCD in the file (there can be more than
	 * one if there is an uncompressed Zip archive as a member
	 * within this Zip archive). */
	for (i = tail - 22; i > 0;) {
		switch (p[i]) {
		case 'P':
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i,
				    current_offset + i);
				if (ret > 0) {
					/* Zip64 EOCD locator precedes
					 * regular EOCD if present. */
					if (i >= 20
					    && memcmp(p + i - 20, "PK\006\007", 4) == 0) {
						read_zip64_eocd(a, zip, p + i - 20);
					}
					return (ret);
				}
			}
			i -= 4;
			break;
		case 'K': i -= 1; break;
		case 005: i -= 2; break;
		case 006: i -= 3; break;
		default: i -= 4; break;
		}
	}
	return 0;
}